

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O3

int Sbd_StoObjBestCut(Sbd_Sto_t *p,int iObj,int nSize,int *pLeaves)

{
  uint uVar1;
  uint uVar2;
  Sbd_Cut_t *pSVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  Sbd_Cut_t *pSVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  
  if (p->Pivot != iObj) {
    __assert_fail("p->Pivot == iObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x326,"int Sbd_StoObjBestCut(Sbd_Sto_t *, int, int, int *)");
  }
  uVar4 = 0xffffffff;
  if (0 < (long)p->nCutsR) {
    lVar8 = 0;
    pSVar7 = (Sbd_Cut_t *)0x0;
    do {
      pSVar3 = p->ppCuts[lVar8];
      uVar1 = *(uint *)&pSVar3->field_0x14;
      uVar6 = uVar1 >> 0x1c;
      if ((((nSize == 0) || (uVar6 == nSize)) &&
          ((uVar1 & 0x3fc00) == 0 && p->nLutSize < (int)uVar6)) &&
         ((int)(uVar1 >> 0x12 & 0x3ff) < p->nLutSize)) {
        if (pSVar7 != (Sbd_Cut_t *)0x0) {
          if ((uVar1 < 0x50000000) || (uVar2 = *(uint *)&pSVar7->field_0x14, uVar2 < 0x50000000)) {
            __assert_fail("pCut0->nLeaves > 4 && pCut1->nLeaves > 4",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                          ,0x13e,"int Sbd_CutCompare2(Sbd_Cut_t *, Sbd_Cut_t *)");
          }
          uVar9 = uVar2 >> 9 & 0x1ff;
          uVar10 = uVar1 >> 9 & 1;
          if (uVar9 < uVar10) goto LAB_00545953;
          if (uVar9 <= uVar10) {
            if ((uVar2 & 0x1ff) < (uVar1 & 0x1ff)) goto LAB_00545953;
            if ((uVar2 & 0x1ff) <= (uVar1 & 0x1ff)) {
              if (pSVar7->Cost < pSVar3->Cost) goto LAB_00545953;
              if (pSVar7->Cost <= pSVar3->Cost) {
                if ((pSVar7->CostLev < pSVar3->CostLev) ||
                   (pSVar7->CostLev <= pSVar3->CostLev && uVar2 >> 0x1c <= uVar6))
                goto LAB_00545953;
              }
            }
          }
        }
        pSVar7 = pSVar3;
      }
LAB_00545953:
      lVar8 = lVar8 + 1;
    } while (p->nCutsR != lVar8);
    if (pSVar7 != (Sbd_Cut_t *)0x0) {
      uVar4 = *(uint *)&pSVar7->field_0x14;
      if (0xafffffff < uVar4) {
        __assert_fail("pCutBest->nLeaves <= SBD_DIV_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                      ,0x33c,"int Sbd_StoObjBestCut(Sbd_Sto_t *, int, int, int *)");
      }
      if (uVar4 < 0x10000000) {
        uVar4 = uVar4 >> 0x1c;
      }
      else {
        uVar5 = 0;
        do {
          pLeaves[uVar5] = pSVar7->pLeaves[uVar5];
          uVar5 = uVar5 + 1;
          uVar4 = *(uint *)&pSVar7->field_0x14 >> 0x1c;
        } while (uVar5 < uVar4);
      }
    }
  }
  return uVar4;
}

Assistant:

int Sbd_StoObjBestCut( Sbd_Sto_t * p, int iObj, int nSize, int * pLeaves )
{
    int fVerbose = 0;
    Sbd_Cut_t * pCutBest = NULL;   int i;
    assert( p->Pivot == iObj );
    if ( fVerbose && iObj % 1000 == 0 )
        printf( "Node %6d : \n", iObj );
    for ( i = 0; i < p->nCutsR; i++ )
    {
        if ( fVerbose && iObj % 1000 == 0 )
            Sbd_CutPrint( p, iObj, p->ppCuts[i] );
        if ( nSize && (int)p->ppCuts[i]->nLeaves != nSize )
            continue;
        if ( (int)p->ppCuts[i]->nLeaves > p->nLutSize && 
             (int)p->ppCuts[i]->nSlowLeaves <= 1 &&
             (int)p->ppCuts[i]->nTopLeaves <= p->nLutSize-1 &&
             (pCutBest == NULL || Sbd_CutCompare2(pCutBest, p->ppCuts[i]) == 1) )
            pCutBest = p->ppCuts[i];
    }
    if ( fVerbose && iObj % 1000 == 0 )
    {
        printf( "Best cut of size %d:\n", nSize );
        Sbd_CutPrint( p, iObj, pCutBest );
    }
    if ( pCutBest == NULL )
        return -1;
    assert( pCutBest->nLeaves <= SBD_DIV_MAX );
    for ( i = 0; i < (int)pCutBest->nLeaves; i++ )
        pLeaves[i] = pCutBest->pLeaves[i];
    return pCutBest->nLeaves;
}